

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O2

void __thiscall Al::internal::ProgressEngine::~ProgressEngine(ProgressEngine *this)

{
  long lVar1;
  
  std::
  _Hashtable<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->run_queues)._M_h);
  lVar1 = 0x7e80;
  do {
    SPSCQueue<Al::internal::AlState_*>::~SPSCQueue
              ((SPSCQueue<Al::internal::AlState_*> *)((long)this->request_queues + lVar1 + -0x80));
    lVar1 = lVar1 + -0x200;
  } while (lVar1 != -0x180);
  std::condition_variable::~condition_variable(&this->startup_cv);
  std::thread::~thread(&this->thread);
  return;
}

Assistant:

ProgressEngine::~ProgressEngine() {}